

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool get_current_path(char *path)

{
  char *pcVar1;
  
  pcVar1 = getcwd(path,0x104);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool get_current_path(char *path)
{
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	char *p = _getcwd(path, MAX_PATH);
	return p != NULL;
#else
	char *p = getcwd(path, MAX_PATH);
	return p != NULL;
#endif
}